

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void template_conformarray(t_template *tfrom,t_template *tto,int *conformaction,_array *a)

{
  t_word *fatso;
  char *pcVar1;
  t_template *ptVar2;
  t_word *ptVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  t_word *wp;
  t_word *in_R8;
  t_word *wp_00;
  long lVar8;
  
  if (a->a_templatesym == tfrom->t_sym) {
    iVar6 = tfrom->t_n << 3;
    lVar4 = (long)(tto->t_n << 3);
    ptVar3 = (t_word *)getbytes(a->a_n * lVar4);
    fatso = (t_word *)a->a_vec;
    if (a->a_elemsize != iVar6) {
      bug("template_conformarray");
    }
    wp = fatso;
    wp_00 = ptVar3;
    for (lVar5 = 0; lVar5 < a->a_n; lVar5 = lVar5 + 1) {
      word_init(wp_00,tto,&a->a_gp);
      template_conformwords(tto,(t_template *)conformaction,&wp->w_index,wp_00,in_R8);
      word_free(wp,tfrom);
      wp_00 = (t_word *)((long)wp_00 + lVar4);
      wp = (t_word *)((long)wp + (long)iVar6);
    }
    a->a_vec = (char *)ptVar3;
    freebytes(fatso,(long)a->a_n * (long)iVar6);
    ptVar2 = tto;
  }
  else {
    ptVar2 = template_findbyname(a->a_templatesym);
  }
  lVar4 = 0;
  for (lVar5 = 0; iVar6 = a->a_n, lVar5 < iVar6; lVar5 = lVar5 + 1) {
    pcVar1 = a->a_vec;
    lVar7 = 0;
    for (lVar8 = 0; lVar8 < ptVar2->t_n; lVar8 = lVar8 + 1) {
      if (*(int *)((long)&ptVar2->t_vec->ds_type + lVar7) == 3) {
        template_conformarray
                  (tfrom,tto,conformaction,*(_array **)(pcVar1 + lVar8 * 8 + iVar6 * lVar4));
      }
      lVar7 = lVar7 + 0x18;
    }
    lVar4 = lVar4 + 8;
  }
  return;
}

Assistant:

static void template_conformarray(t_template *tfrom, t_template *tto,
    int *conformaction, t_array *a)
{
    int i, j;
    t_template *scalartemplate = 0;
    if (a->a_templatesym == tfrom->t_sym)
    {
        /* the array elements must all be conformed */
        int oldelemsize = sizeof(t_word) * tfrom->t_n,
            newelemsize = sizeof(t_word) * tto->t_n;
        char *newarray = getbytes(newelemsize * a->a_n);
        char *oldarray = a->a_vec;
        if (a->a_elemsize != oldelemsize)
            bug("template_conformarray");
        for (i = 0; i < a->a_n; i++)
        {
            t_word *wp = (t_word *)(newarray + newelemsize * i);
            word_init(wp, tto, &a->a_gp);
            template_conformwords(tfrom, tto, conformaction,
                (t_word *)(oldarray + oldelemsize * i), wp);
            word_free((t_word *)(oldarray + oldelemsize * i), tfrom);
        }
        scalartemplate = tto;
        a->a_vec = newarray;
        freebytes(oldarray, oldelemsize * a->a_n);
    }
    else scalartemplate = template_findbyname(a->a_templatesym);
        /* convert all arrays and sublist fields in each element of the array */
    for (i = 0; i < a->a_n; i++)
    {
        t_word *wp = (t_word *)(a->a_vec + sizeof(t_word) * a->a_n * i);
        for (j = 0; j < scalartemplate->t_n; j++)
        {
            t_dataslot *ds = scalartemplate->t_vec + j;
            if (ds->ds_type == DT_ARRAY)
            {
                template_conformarray(tfrom, tto, conformaction,
                    wp[j].w_array);
            }
        }
    }
}